

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void upb_MtDecoder_PushOneof(upb_MtDecoder *d,upb_LayoutItem item)

{
  upb_LayoutItem item_00;
  upb_LayoutItem item_01;
  undefined8 uVar1;
  short sVar2;
  upb_MtDecoder *d_local;
  undefined8 local_14;
  upb_LayoutItem item_local;
  
  local_14._0_2_ = item.field_index;
  if ((uint16_t)local_14 == 0xffff) {
    upb_MdDecoder_ErrorJmp(&d->base,"Empty oneof");
  }
  sVar2 = (uint16_t)local_14 - 3;
  local_14._2_6_ = item._2_6_;
  local_14 = CONCAT62(local_14._2_6_,sVar2);
  uVar1 = local_14;
  item_01.type = kUpb_LayoutItemType_OneofField;
  item_01.field_index = sVar2;
  item_01.offset = local_14._2_2_;
  item_01.rep = local_14._4_4_;
  upb_MtDecoder_PushItem(d,item_01);
  local_14._0_4_ = (undefined4)uVar1;
  item_00.type = kUpb_LayoutItemType_OneofCase;
  item_00.field_index = (uint16_t)local_14;
  item_00.offset = local_14._2_2_;
  item_00.rep = 1;
  upb_MtDecoder_PushItem(d,item_00);
  return;
}

Assistant:

static void upb_MtDecoder_PushOneof(upb_MtDecoder* d, upb_LayoutItem item) {
  if (item.field_index == kUpb_LayoutItem_IndexSentinel) {
    upb_MdDecoder_ErrorJmp(&d->base, "Empty oneof");
  }
  item.field_index -= kOneofBase;

  // Push oneof data.
  item.type = kUpb_LayoutItemType_OneofField;
  upb_MtDecoder_PushItem(d, item);

  // Push oneof case.
  item.rep = kUpb_FieldRep_4Byte;  // Field Number.
  item.type = kUpb_LayoutItemType_OneofCase;
  upb_MtDecoder_PushItem(d, item);
}